

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ModifyTests::ModifyTests
          (ModifyTests *this,EglTestContext *eglTestCtx,string *name,string *desc)

{
  string *desc_local;
  string *name_local;
  EglTestContext *eglTestCtx_local;
  ModifyTests *this_local;
  
  ImageTests::ImageTests(&this->super_ImageTests,eglTestCtx,name,desc);
  (this->super_ImageTests).super_TestCaseGroup.super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ModifyTests_00677918;
  LabeledActions::LabeledActions(&this->m_modifyActions);
  GLES2ImageApi::RenderTryAll::RenderTryAll(&this->m_renderAction);
  return;
}

Assistant:

ModifyTests		(EglTestContext& eglTestCtx, const string& name, const string& desc)
									: ImageTests(eglTestCtx, name, desc) {}